

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringpiece.h
# Opt level: O0

string * __thiscall
google::protobuf::StringPiece::ToString_abi_cxx11_(string *__return_storage_ptr__,StringPiece *this)

{
  char *pcVar1;
  ulong uVar2;
  allocator local_19;
  StringPiece *local_18;
  StringPiece *this_local;
  
  local_18 = this;
  this_local = (StringPiece *)__return_storage_ptr__;
  if (this->ptr_ == (char *)0x0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  else {
    pcVar1 = data(this);
    uVar2 = size(this);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,uVar2,&local_19);
    std::allocator<char>::~allocator((allocator<char> *)&local_19);
  }
  return __return_storage_ptr__;
}

Assistant:

string ToString() const {
    if (ptr_ == NULL) return string();
    return string(data(), size());
  }